

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O3

void icu_63::util_append64(UnicodeString *result,int64_t n)

{
  uint32_t textLength;
  UnicodeString temp;
  UChar buffer [256];
  UnicodeString UStack_258;
  UChar local_218 [256];
  
  textLength = util64_tou(n,local_218,0x200,10,'\0');
  UnicodeString::UnicodeString(&UStack_258,local_218,textLength);
  if (-1 < UStack_258.fUnion.fStackFields.fLengthAndFlags) {
    UStack_258.fUnion.fFields.fLength = (int)UStack_258.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::doAppend(result,&UStack_258,0,UStack_258.fUnion.fFields.fLength);
  UnicodeString::~UnicodeString(&UStack_258);
  return;
}

Assistant:

static void util_append64(UnicodeString& result, int64_t n)
{
    UChar buffer[256];
    int32_t len = util64_tou(n, buffer, sizeof(buffer));
    UnicodeString temp(buffer, len);
    result.append(temp);
}